

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

void Curl_ssl_close_all(Curl_easy *data)

{
  curl_ssl_session *pcVar1;
  long lVar2;
  ulong uVar3;
  
  pcVar1 = (data->state).session;
  if ((pcVar1 != (curl_ssl_session *)0x0) &&
     ((data->share == (Curl_share *)0x0 || ((data->share->specifier & 0x10) == 0)))) {
    if ((data->set).general_ssl.max_ssl_sessions != 0) {
      lVar2 = 0;
      uVar3 = 0;
      do {
        Curl_ssl_kill_session((curl_ssl_session *)((long)&((data->state).session)->name + lVar2));
        uVar3 = uVar3 + 1;
        lVar2 = lVar2 + 0x88;
      } while (uVar3 < (data->set).general_ssl.max_ssl_sessions);
      pcVar1 = (data->state).session;
    }
    (*Curl_cfree)(pcVar1);
    (data->state).session = (curl_ssl_session *)0x0;
  }
  (*Curl_ssl->close_all)(data);
  return;
}

Assistant:

void Curl_ssl_close_all(struct Curl_easy *data)
{
  /* kill the session ID cache if not shared */
  if(data->state.session && !SSLSESSION_SHARED(data)) {
    size_t i;
    for(i = 0; i < data->set.general_ssl.max_ssl_sessions; i++)
      /* the single-killer function handles empty table slots */
      Curl_ssl_kill_session(&data->state.session[i]);

    /* free the cache data */
    Curl_safefree(data->state.session);
  }

  Curl_ssl->close_all(data);
}